

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall
slang::parsing::Lexer::create<slang::syntax::SyntaxKind&>
          (Lexer *this,TokenKind kind,SyntaxKind *args)

{
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText;
  Token TVar1;
  TokenKind extraout_var;
  EVP_PKEY_CTX *src;
  BumpAllocator *extraout_RDX;
  undefined2 in_SI;
  char *in_RDI;
  SourceLocation location;
  Lexer *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  BufferID in_stack_ffffffffffffff74;
  TokenKind kind_00;
  BumpAllocator *alloc;
  Token *in_stack_ffffffffffffffb8;
  SourceLocation in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffe0;
  char *pcVar3;
  SyntaxKind in_stack_fffffffffffffff0;
  undefined1 auStack_c [12];
  
  uVar2 = *(undefined4 *)(in_RDI + 0x50);
  pcVar3 = in_RDI;
  SourceLocation::SourceLocation
            ((SourceLocation *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff74,(uint64_t)in_stack_ffffffffffffff60);
  SmallVectorBase<slang::parsing::Trivia>::copy
            ((SmallVectorBase<slang::parsing::Trivia> *)(in_RDI + 0x80),*(EVP_PKEY_CTX **)in_RDI,src
            );
  alloc = extraout_RDX;
  kind_00 = extraout_var;
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
  span<slang::parsing::Trivia,_18446744073709551615UL>
            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffff74.id,in_stack_ffffffffffffff70),
             (span<slang::parsing::Trivia,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  lexeme(in_stack_ffffffffffffff60);
  trivia._M_ptr._4_4_ = uVar2;
  trivia._M_ptr._0_4_ = in_stack_ffffffffffffffc8;
  trivia._M_extent._M_extent_value = in_stack_ffffffffffffffd0._M_extent_value;
  rawText._M_len._6_2_ = in_SI;
  rawText._M_len._0_6_ = in_stack_ffffffffffffffe0;
  rawText._M_str = pcVar3;
  Token::Token(in_stack_ffffffffffffffb8,alloc,kind_00,trivia,rawText,in_stack_ffffffffffffffc0,
               in_stack_fffffffffffffff0);
  TVar1._4_12_ = auStack_c;
  TVar1.kind = (short)in_stack_fffffffffffffff0;
  TVar1._2_1_ = (char)(in_stack_fffffffffffffff0 >> 0x10);
  TVar1.numFlags.raw = (char)(in_stack_fffffffffffffff0 >> 0x18);
  return TVar1;
}

Assistant:

Token Lexer::create(TokenKind kind, Args&&... args) {
    SourceLocation location(bufferId, size_t(marker - originalBegin));
    return Token(alloc, kind, triviaBuffer.copy(alloc), lexeme(), location,
                 std::forward<Args>(args)...);
}